

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O3

cilk_fiber * cilk_fiber::allocate(cilk_fiber_pool *pool)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  cilk_fiber *pcVar4;
  
  do {
    if (pool->lock != (spin_mutex *)0x0) {
      spin_mutex_lock(pool->lock);
    }
    if (pool->size != 0) {
      uVar3 = pool->size - 1;
      pool->size = uVar3;
      pcVar4 = pool->fibers[uVar3];
      if (pcVar4 != (cilk_fiber *)0x0) {
        if (pool->lock == (spin_mutex *)0x0) {
          return pcVar4;
        }
        spin_mutex_unlock(pool->lock);
        return pcVar4;
      }
    }
    iVar1 = pool->total;
    iVar2 = pool->alloc_max;
    if (iVar1 < iVar2) {
      pool->total = iVar1 + 1;
      if (pool->high_water <= iVar1) {
        pool->high_water = iVar1 + 1;
      }
    }
    if (pool->lock != (spin_mutex *)0x0) {
      spin_mutex_unlock(pool->lock);
    }
    if (iVar1 < iVar2) {
      pcVar4 = allocate_from_heap(pool->stack_size);
      if (pcVar4 != (cilk_fiber *)0x0) {
        return pcVar4;
      }
      if (pool->lock == (spin_mutex *)0x0) {
        pool->total = pool->total + -1;
      }
      else {
        spin_mutex_lock(pool->lock);
        pool->total = pool->total + -1;
        if (pool->lock != (spin_mutex *)0x0) {
          spin_mutex_unlock(pool->lock);
        }
      }
    }
    pool = pool->parent;
  } while (pool != (cilk_fiber_pool *)0x0);
  return (cilk_fiber *)0x0;
}

Assistant:

cilk_fiber* cilk_fiber::allocate(cilk_fiber_pool* pool)
{
    // Pool should not be NULL in this method.  But I'm not going to
    // actually assert it, because we are likely to seg fault anyway
    // if it is.
    // CILK_ASSERT(NULL != pool);

    cilk_fiber *ret = NULL;

#if USE_FIBER_TRY_ALLOCATE_FROM_POOL
    // "Fast" path, which doesn't go to the heap or OS until checking
    // the ancestors first.
    ret = try_allocate_from_pool_recursive(pool);
    if (ret)
        return ret;
#endif

    // If we don't get anything from the "fast path", then go through
    // a slower path to look for a fiber.
    //
    //  1. Lock the pool if it is shared.
    //  2. Look in our local pool.  If we find one, release the lock
    //     and quit searching.
    //  3. Otherwise, check whether we can allocate from heap.
    //  4. Release the lock if it was acquired.
    //  5. Try to allocate from the heap, if step 3 said we could.
    //     If we find a fiber, then quit searching.
    //  6. If none of these steps work, just recursively try again
    //     from the parent.

    // 1. Lock the pool if it is shared.
    if (pool->lock) {
        spin_mutex_lock(pool->lock);
    }

    // 2. Look in local pool.
    if (pool->size > 0) {
        ret = pool->fibers[--pool->size];
        if (ret) {
            // If we found one, release the lock once we are
            // done updating pool fields, and break out of the
            // loop.
            if (pool->lock) {
                spin_mutex_unlock(pool->lock);
            }

            // When we pull a fiber out of the pool, set its reference
            // count just in case.
            ret->init_ref_count(1);
            return ret;
        }
    }

    // 3. Check whether we can allocate from the heap.
    bool can_allocate_from_heap = false;
    if (pool->total < pool->alloc_max) {
        // Track that we are allocating a new fiber from the
        // heap, originating from this pool.
        // This increment may be undone if we happen to fail to
        // allocate from the heap.
        increment_pool_total(pool);
        can_allocate_from_heap = true;
    }

    // 4. Unlock the pool, and then allocate from the heap.
    if (pool->lock) {
        spin_mutex_unlock(pool->lock);
    }

    // 5. Actually try to allocate from the heap / OS.
    if (can_allocate_from_heap) {
        ret = allocate_from_heap(pool->stack_size);
        // If we got something from the heap, just return it.
        if (ret) {
            return ret;
        }

        // Otherwise, we failed in our attempt to allocate a
        // fiber from the heap.  Grab the lock and decrement
        // the total again.
        if (pool->lock) {
            spin_mutex_lock(pool->lock);
        }
        decrement_pool_total(pool, 1);
        if (pool->lock) {
            spin_mutex_unlock(pool->lock);
        }
    }

    // 6. If we get here, then searching this pool failed.  Go search
    // the parent instead if we have one.
    if (pool->parent) {
        return allocate(pool->parent);
    }
    
    return ret;
}